

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readasy.c
# Opt level: O1

int it_asy_read_sample_header(IT_SAMPLE *sample,DUMBFILE *f)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int32 iVar5;
  int32 iVar6;
  int iVar7;
  double dVar8;
  
  dumbfile_getnc((char *)sample,0x16,f);
  sample->name[0x16] = '\0';
  sample->filename[0] = '\0';
  iVar2 = dumbfile_getc(f);
  uVar3 = dumbfile_getc(f);
  sample->default_volume = (uchar)uVar3;
  sample->global_volume = '@';
  if (0x40 < (uVar3 & 0xff)) {
    sample->default_volume = '@';
  }
  iVar4 = dumbfile_getc(f);
  iVar5 = dumbfile_igetl(f);
  sample->length = iVar5;
  iVar5 = dumbfile_igetl(f);
  sample->loop_start = iVar5;
  iVar6 = dumbfile_igetl(f);
  iVar7 = iVar6 + iVar5;
  sample->loop_end = iVar7;
  iVar1 = sample->length;
  if (0 < iVar1) {
    sample->flags = '\x01';
    sample->default_pan = '\0';
    dVar8 = exp2((double)(int)(char)iVar4 * 0.0833333333333334);
    sample->C5_speed = (int)(dVar8 * 16574.27570093458);
    sample->finetune = (short)((iVar2 << 0x1c) >> 0x17);
    if ((iVar7 <= iVar1) && (2 < iVar7 - sample->loop_start)) {
      sample->flags = '\x11';
    }
    sample->vibrato_speed = '\0';
    sample->vibrato_depth = '\0';
    sample->vibrato_rate = '\0';
    sample->vibrato_waveform = '\0';
    sample->max_resampling_quality = -1;
    iVar2 = dumbfile_error(f);
    return iVar2;
  }
  sample->flags = '\0';
  return 0;
}

Assistant:

static int it_asy_read_sample_header( IT_SAMPLE *sample, DUMBFILE *f )
{
	int finetune, key_offset;

/**
     21       22   Chars     Sample 1 name.  If the name is not a full
                             22 chars in length, it will be null
                             terminated.

If
the sample name begins with a '#' character (ASCII $23 (35)) then this is
assumed not to be an instrument name, and is probably a message.
*/
    dumbfile_getnc( (char *) sample->name, 22, f );
	sample->name[22] = 0;

	sample->filename[0] = 0;

/** Each  finetune step changes  the note 1/8th  of  a  semitone. */
	finetune = ( signed char ) ( dumbfile_getc( f ) << 4 ) >> 4; /* signed nibble */
	sample->default_volume = dumbfile_getc( f ); // Should we be setting global_volume to this instead?
	sample->global_volume = 64;
	if ( sample->default_volume > 64 ) sample->default_volume = 64;
	key_offset = ( signed char ) dumbfile_getc( f ); /* base key offset */
	sample->length = dumbfile_igetl( f );
	sample->loop_start = dumbfile_igetl( f );
	sample->loop_end = sample->loop_start + dumbfile_igetl( f );

	if ( sample->length <= 0 ) {
		sample->flags = 0;
		return 0;
	}

	sample->flags = IT_SAMPLE_EXISTS;

	sample->default_pan = 0;
	sample->C5_speed = (int)( AMIGA_CLOCK / 214.0 * pow( DUMB_SEMITONE_BASE, key_offset ) );//( long )( 16726.0 * pow( DUMB_PITCH_BASE, finetune * 32 ) );
	sample->finetune = finetune * 32;
	// the above line might be wrong

	if ( ( sample->loop_end - sample->loop_start > 2 ) && ( sample->loop_end <= sample->length ) )
		sample->flags |= IT_SAMPLE_LOOP;

	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = 0; // do we have to set _all_ these?
	sample->max_resampling_quality = -1;

	return dumbfile_error(f);
}